

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maybe.hpp
# Opt level: O0

maybe<unsigned_int,_void> * __thiscall
pstore::maybe<unsigned_int,_void>::operator=
          (maybe<unsigned_int,_void> *this,maybe<unsigned_int,_void> *other)

{
  bool bVar1;
  uint *other_00;
  maybe<unsigned_int,_void> *other_local;
  maybe<unsigned_int,_void> *this_local;
  
  if (other != this) {
    bVar1 = has_value(other);
    if (bVar1) {
      other_00 = value(other);
      maybe<unsigned_int,void>::operator=((maybe<unsigned_int,void> *)this,other_00);
    }
    else {
      reset(this);
    }
  }
  return this;
}

Assistant:

maybe &
        operator= (maybe && other) noexcept (std::is_nothrow_move_assignable<T>::value &&
                                                 std::is_nothrow_move_constructible<T>::value) {

            if (&other != this) {
                if (!other.has_value ()) {
                    this->reset ();
                } else {
                    this->operator= (std::forward<T> (other.value ()));
                }
            }
            return *this;
        }